

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_timings.c
# Opt level: O0

int manual_check(nvamemtiming_conf *conf)

{
  FILE *__stream;
  FILE *outf;
  char outfile [21];
  nvamemtiming_conf *conf_local;
  
  snprintf((char *)&outf,0x14,"entry_%i_%i",(ulong)(conf->field_4).manual.index,
           (ulong)(conf->field_4).manual.value);
  __stream = fopen((char *)&outf,"wb");
  if (__stream != (FILE *)0x0) {
    printf("Manual mode: set index %i to value 0x%x\n",(ulong)(conf->field_4).manual.index,
           (ulong)(conf->field_4).manual.value);
    (conf->vbios).data
    [(int)((uint)(conf->vbios).timing_entry_offset + (uint)(conf->field_4).manual.index)] =
         (conf->field_4).manual.value;
    launch(conf,(FILE *)__stream,'\0',NO_COLOR);
    fclose(__stream);
  }
  else {
    perror("Open the output file");
  }
  conf_local._4_4_ = (uint)(__stream == (FILE *)0x0);
  return conf_local._4_4_;
}

Assistant:

int manual_check(struct nvamemtiming_conf *conf)
{
	char outfile[21];

	snprintf(outfile, 20, "entry_%i_%i", conf->manual.index, conf->manual.value);

	/* TODO: get this filename from the command line */
	FILE *outf = fopen(outfile, "wb");
	if (!outf) {
		perror("Open the output file");
		return 1;
	}

	printf("Manual mode: set index %i to value 0x%x\n", conf->manual.index, conf->manual.value);

	conf->vbios.data[conf->vbios.timing_entry_offset + conf->manual.index] = conf->manual.value;
	launch(conf, outf, 0, NO_COLOR);

	fclose(outf);

	return 0;
}